

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_test.cc
# Opt level: O0

void __thiscall ThreadPoolTest_Print_test_Test::TestBody(ThreadPoolTest_Print_test_Test *this)

{
  int i;
  ThreadPool pool;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  _func_void_int *in_stack_fffffffffffffdd8;
  ThreadPool *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  ThreadPool *in_stack_fffffffffffffe10;
  _Bind<void_(*(int))(int)> *in_stack_fffffffffffffe60;
  ThreadPool *in_stack_fffffffffffffe68;
  int local_12c;
  
  ThreadPool::ThreadPool
            (in_stack_fffffffffffffe10,CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
            );
  for (local_12c = 0; local_12c < 3; local_12c = local_12c + 1) {
    std::bind<void(&)(int),int>
              (in_stack_fffffffffffffdd8,
               (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::future<void>::~future((future<void> *)0x1546ff);
    std::bind<void(&)(int),int>
              (in_stack_fffffffffffffdd8,
               (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::future<void>::~future((future<void> *)0x154754);
    std::bind<void(&)(int),int>
              (in_stack_fffffffffffffdd8,
               (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::future<void>::~future((future<void> *)0x1547a9);
    std::bind<void(&)(int),int>
              (in_stack_fffffffffffffdd8,
               (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::future<void>::~future((future<void> *)0x1547ec);
    std::bind<void(&)(int),int>
              (in_stack_fffffffffffffdd8,
               (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::future<void>::~future((future<void> *)0x15482f);
    in_stack_fffffffffffffdd4 = 6;
    std::bind<void(&)(int),int>
              (in_stack_fffffffffffffdd8,(int *)CONCAT44(6,in_stack_fffffffffffffdd0));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::future<void>::~future((future<void> *)0x154872);
    ThreadPool::Sync(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
    printf("Hello master\n");
  }
  printf("final\n");
  usleep(100);
  ThreadPool::~ThreadPool(in_stack_fffffffffffffe00);
  return;
}

Assistant:

TEST(ThreadPoolTest, Print_test) {
  ThreadPool pool(4);
  for (int i = 0; i < 3; ++i) {
    pool.enqueue(std::bind(func, 1));
    pool.enqueue(std::bind(func, 2));
    pool.enqueue(std::bind(func, 3));
    pool.enqueue(std::bind(func, 4));
    pool.enqueue(std::bind(func, 5));
    pool.enqueue(std::bind(func, 6));
    pool.Sync(6);
    printf("Hello master\n");
  }
  printf("final\n");
#ifndef _MSC_VER
  usleep(100);
#else
  std::this_thread::sleep_for(std::chrono::microseconds(100));
#endif
}